

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTcSymProp::gen_code_addr(CTcSymProp *this)

{
  CTcDataStream *in_RDI;
  uchar in_stack_000000df;
  CTcGenTarg *in_stack_000000e0;
  uint in_stack_ffffffffffffffec;
  
  CTcGenTarg::write_op(in_stack_000000e0,in_stack_000000df);
  CTcDataStream::write_prop_id(in_RDI,in_stack_ffffffffffffffec);
  CTcGenTarg::note_push((CTcGenTarg *)0x28387e);
  return;
}

Assistant:

void CTcSymProp::gen_code_addr()
{
    /* write code to push the property ID */
    G_cg->write_op(OPC_PUSHPROPID);
    G_cs->write_prop_id(prop_);

    /* note the push */
    G_cg->note_push();
}